

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_lib.cc
# Opt level: O1

int DTLSv1_handle_timeout(SSL *ssl)

{
  DTLS1_STATE *pDVar1;
  int iVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint uVar7;
  OPENSSL_timeval now;
  OPENSSL_timeval now_00;
  
  bssl::ssl_reset_error_state(ssl);
  iVar2 = SSL_is_dtls(ssl);
  if (iVar2 == 0) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_lib.cc"
                  ,0xbe);
    iVar2 = -1;
  }
  else {
    pDVar1 = ssl->d1;
    if (((((pDVar1->ack_timer).expire_time_.tv_sec != 0) ||
         ((pDVar1->ack_timer).expire_time_.tv_usec != 0)) ||
        ((pDVar1->retransmit_timer).expire_time_.tv_sec != 0)) ||
       ((pDVar1->retransmit_timer).expire_time_.tv_usec != 0)) {
      now_00 = bssl::ssl_ctx_get_current_time
                         ((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                          ._M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
      pDVar1 = ssl->d1;
      uVar4 = bssl::DTLSTimer::MicrosecondsRemaining(&pDVar1->ack_timer,now_00);
      if (uVar4 == 0) {
        *(byte *)pDVar1 = *(byte *)pDVar1 | 0x40;
        pDVar1 = ssl->d1;
        (pDVar1->ack_timer).expire_time_.tv_sec = 0;
        (pDVar1->ack_timer).expire_time_.tv_usec = 0;
      }
      pDVar1 = ssl->d1;
      now._12_4_ = 0;
      now.tv_sec = SUB128(now_00._0_12_,0);
      now.tv_usec = SUB124(now_00._0_12_,8);
      uVar5 = bssl::DTLSTimer::MicrosecondsRemaining(&pDVar1->retransmit_timer,now);
      if (uVar5 == 0) {
        *(byte *)pDVar1 = *(byte *)pDVar1 | 0x20;
        pDVar1 = ssl->d1;
        (pDVar1->retransmit_timer).expire_time_.tv_sec = 0;
        (pDVar1->retransmit_timer).expire_time_.tv_usec = 0;
        uVar7 = pDVar1->num_timeouts + 1;
        pDVar1->num_timeouts = uVar7;
        if (2 < uVar7) {
          uVar3 = SSL_get_options(ssl);
          if ((uVar3 >> 0xc & 1) == 0) {
            uVar6 = BIO_ctrl((BIO *)(ssl->wbio)._M_t.
                                    super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,0x2f,0,
                             (void *)0x0);
            if (uVar6 < 0x40000001) {
              uVar7 = bssl::dtls1_min_mtu();
              if (uVar7 <= (uint)uVar6) {
                ssl->d1->mtu = (uint)uVar6;
              }
            }
          }
        }
LAB_0023e26a:
        iVar2 = bssl::dtls1_flush(ssl);
        return iVar2;
      }
      if (uVar4 == 0) goto LAB_0023e26a;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int DTLSv1_handle_timeout(SSL *ssl) {
  ssl_reset_error_state(ssl);

  if (!SSL_is_dtls(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return -1;
  }

  if (!ssl->d1->ack_timer.IsSet() && !ssl->d1->retransmit_timer.IsSet()) {
    // No timers are running. Don't bother querying the clock.
    return 0;
  }

  OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
  bool any_timer_expired = false;
  if (ssl->d1->ack_timer.IsExpired(now)) {
    any_timer_expired = true;
    ssl->d1->sending_ack = true;
    ssl->d1->ack_timer.Stop();
  }

  if (ssl->d1->retransmit_timer.IsExpired(now)) {
    any_timer_expired = true;
    ssl->d1->sending_flight = true;
    ssl->d1->retransmit_timer.Stop();

    ssl->d1->num_timeouts++;
    // Reduce MTU after 2 unsuccessful retransmissions.
    if (ssl->d1->num_timeouts > DTLS1_MTU_TIMEOUTS &&
        !(SSL_get_options(ssl) & SSL_OP_NO_QUERY_MTU)) {
      long mtu = BIO_ctrl(ssl->wbio.get(), BIO_CTRL_DGRAM_GET_FALLBACK_MTU, 0,
                          nullptr);
      if (mtu >= 0 && mtu <= (1 << 30) && (unsigned)mtu >= dtls1_min_mtu()) {
        ssl->d1->mtu = (unsigned)mtu;
      }
    }
  }

  if (!any_timer_expired) {
    return 0;
  }

  return dtls1_flush(ssl);
}